

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O0

int get_file_size(char *filename,int64_t *file_size)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined1 local_b0 [8];
  stat statbuf;
  int64_t *file_size_local;
  char *filename_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)file_size;
  if ((filename != (char *)0x0) && (file_size != (int64_t *)0x0)) {
    iVar1 = stat(filename,(stat *)local_b0);
    if (iVar1 == 0) {
      if (((uint)statbuf.st_nlink & 0x8000) == 0) {
        coda_set_error(-0x15,"could not open %s (not a regular file)",filename);
        filename_local._4_4_ = -1;
      }
      else {
        *(__dev_t *)statbuf.__glibc_reserved[2] = statbuf.st_rdev;
        filename_local._4_4_ = 0;
      }
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 2) {
        coda_set_error(-0x14,"could not find %s",filename);
      }
      else {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        coda_set_error(-0x15,"could not open %s (%s)",filename,pcVar3);
      }
      filename_local._4_4_ = -1;
    }
    return filename_local._4_4_;
  }
  __assert_fail("filename != NULL && file_size != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                ,0x9d,"int get_file_size(const char *, int64_t *)");
}

Assistant:

static int get_file_size(const char *filename, int64_t *file_size)
{
    struct stat statbuf;

    assert(filename != NULL && file_size != NULL);

    /* stat() the file to be opened */

    if (stat(filename, &statbuf) != 0)
    {
        if (errno == ENOENT)
        {
            coda_set_error(CODA_ERROR_FILE_NOT_FOUND, "could not find %s", filename);
        }
        else
        {
            coda_set_error(CODA_ERROR_FILE_OPEN, "could not open %s (%s)", filename, strerror(errno));
        }
        return -1;
    }

    /* check that the file is a regular file */

    if ((statbuf.st_mode & S_IFREG) == 0)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open %s (not a regular file)", filename);
        return -1;
    }

    /* get file size */

    *file_size = statbuf.st_size;

    return 0;
}